

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O1

CURLcode tool_setopt(CURL *curl,_Bool str,GlobalConfig *global,OperationConfig *config,char *name,
                    CURLoption tag,...)

{
  CURLcode CVar1;
  char *pcVar2;
  char *pcVar3;
  size_t len;
  va_list arg;
  
  CVar1 = curl_easy_setopt(curl,tag,arg[0].overflow_arg_area);
  if (CVar1 == CURLE_OK &&
      (arg[0].overflow_arg_area != (void *)0x0 && global->libcurl != (char *)0x0)) {
    if (str) {
      len = 0xffffffffffffffff;
      if (tag == CURLOPT_POSTFIELDS) {
        len = curlx_dyn_len(&config->postdata);
      }
      pcVar2 = c_escape((char *)arg[0].overflow_arg_area,len);
      if (pcVar2 == (char *)0x0) {
        CVar1 = CURLE_OK;
      }
      else {
        CVar1 = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, \"%s\");",name,pcVar2);
        free(pcVar2);
      }
    }
    else {
      pcVar2 = "object";
      if (19999 < tag) {
        pcVar2 = "function";
      }
      pcVar3 = "";
      if (*pcVar2 == 'o') {
        pcVar3 = "n";
      }
      CVar1 = easysrc_addf(&easysrc_toohard,"%s was set to a%s %s pointer",name,pcVar3);
    }
  }
  return CVar1;
}

Assistant:

CURLcode tool_setopt(CURL *curl, bool str, struct GlobalConfig *global,
                     struct OperationConfig *config,
                     const char *name, CURLoption tag, ...)
{
  va_list arg;
  CURLcode ret = CURLE_OK;
  void *pval;

  va_start(arg, tag);

  DEBUGASSERT(tag >= CURLOPTTYPE_OBJECTPOINT);
  DEBUGASSERT((tag < CURLOPTTYPE_OFF_T) || (tag >= CURLOPTTYPE_BLOB));

  /* we never set _BLOB options in the curl tool */
  DEBUGASSERT(tag < CURLOPTTYPE_BLOB);

  /* argument is an object or function pointer */
  pval = va_arg(arg, void *);

  ret = curl_easy_setopt(curl, tag, pval);

  va_end(arg);

  if(global->libcurl && pval && !ret) {
    /* we only use this if --libcurl was used */

    if(!str) {
      /* function pointers are never printable */
      const char *remark = (tag >= CURLOPTTYPE_FUNCTIONPOINT) ?
        "function" : "object";
      ret = easysrc_addf(&easysrc_toohard,
                         "%s was set to a%s %s pointer", name,
                         (*remark == 'o' ? "n" : ""), remark);
    }
    else {
      curl_off_t len = ZERO_TERMINATED;
      char *escaped;
      if(tag == CURLOPT_POSTFIELDS)
        len = curlx_dyn_len(&config->postdata);
      escaped = c_escape(pval, len);
      if(escaped) {
        ret = easysrc_addf(&easysrc_code, "curl_easy_setopt(hnd, %s, \"%s\");",
                           name, escaped);
        free(escaped);
      }
    }
  }

  return ret;
}